

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O0

Shrinkables<int> * __thiscall
rc::gen::detail::generateShrinkables<int,rc::fn::Constant<bool>>
          (Shrinkables<int> *__return_storage_ptr__,detail *this,Random *random,int size,
          size_t count,Gen<int> *gen,Constant<bool> predicate)

{
  size_type sVar1;
  GenerationFailure *this_00;
  undefined4 in_register_0000000c;
  size_type __n;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [88];
  undefined1 local_c0 [8];
  Shrinkable<int> shrinkable;
  int tries;
  int currentSize;
  Random r;
  Gen<int> *gen_local;
  size_t count_local;
  int size_local;
  Random *random_local;
  Shrinkables<int> *pSStack_10;
  Constant<bool> predicate_local;
  Shrinkables<int> *shrinkables;
  
  __n = CONCAT44(in_register_0000000c,size);
  random_local._7_1_ = SUB81(gen,0);
  pSStack_10 = __return_storage_ptr__;
  std::vector<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>::vector
            (__return_storage_ptr__);
  std::vector<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>::reserve
            (__return_storage_ptr__,__n);
  shrinkable.m_impl._4_4_ = 0;
  do {
    sVar1 = std::vector<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>::size
                      (__return_storage_ptr__);
    if (__n <= sVar1) {
      return __return_storage_ptr__;
    }
    Random::split((Random *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
    Gen<int>::operator()((Gen<int> *)local_c0,(Random *)count,(int)local_118);
    in_stack_fffffffffffffe67 =
         fn::Constant<bool>::operator()
                   ((Constant<bool> *)((long)&random_local + 7),(Shrinkable<int> *)local_c0);
    if ((bool)in_stack_fffffffffffffe67) {
      std::vector<rc::Shrinkable<int>,_std::allocator<rc::Shrinkable<int>_>_>::push_back
                (__return_storage_ptr__,(value_type *)local_c0);
      shrinkable.m_impl._4_4_ = 0;
    }
    else {
      shrinkable.m_impl._4_4_ = shrinkable.m_impl._4_4_ + 1;
      if (99 < shrinkable.m_impl._4_4_) {
        this_00 = (GenerationFailure *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_178,__n);
        std::operator+(&local_158,"Gave up trying to generate ",&local_178);
        std::operator+(&local_138,&local_158," values for container");
        GenerationFailure::GenerationFailure(this_00,&local_138);
        __cxa_throw(this_00,&GenerationFailure::typeinfo,GenerationFailure::~GenerationFailure);
      }
    }
    Shrinkable<int>::~Shrinkable((Shrinkable<int> *)local_c0);
  } while( true );
}

Assistant:

Shrinkables<T> generateShrinkables(const Random &random,
                                   int size,
                                   std::size_t count,
                                   const Gen<T> &gen,
                                   Predicate predicate) {
  Random r(random);
  Shrinkables<T> shrinkables;
  shrinkables.reserve(count);

  auto currentSize = size;
  int tries = 0;
  while (shrinkables.size() < count) {
    auto shrinkable = gen(r.split(), currentSize);
    if (predicate(shrinkable)) {
      shrinkables.push_back(std::move(shrinkable));
      tries = 0;
    } else {
      tries++;
      if (tries >= 100) {
        // TODO magic constant!
        throw GenerationFailure("Gave up trying to generate " +
                                std::to_string(count) +
                                " values for container");
      }
      currentSize++;
    }
  }

  return shrinkables;
}